

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O1

void __thiscall
icu_63::DecimalFormat::setPositiveSuffix(DecimalFormat *this,UnicodeString *newValue)

{
  ushort uVar1;
  short sVar2;
  DecimalFormatProperties *pDVar3;
  UBool UVar4;
  uint in_EAX;
  int len;
  int iVar5;
  bool bVar6;
  UErrorCode localStatus;
  undefined8 uStack_18;
  
  pDVar3 = (this->fields->properties).
           super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  uVar1 = (newValue->fUnion).fStackFields.fLengthAndFlags;
  uStack_18._0_4_ = in_EAX;
  if ((uVar1 & 1) == 0) {
    if ((short)uVar1 < 0) {
      len = (newValue->fUnion).fFields.fLength;
    }
    else {
      len = (int)(short)uVar1 >> 5;
    }
    sVar2 = (pDVar3->positiveSuffix).fUnion.fStackFields.fLengthAndFlags;
    if (sVar2 < 0) {
      iVar5 = (pDVar3->positiveSuffix).fUnion.fFields.fLength;
    }
    else {
      iVar5 = (int)sVar2 >> 5;
    }
    bVar6 = false;
    if ((((int)sVar2 & 1U) == 0) && (bVar6 = false, len == iVar5)) {
      UVar4 = UnicodeString::doEquals(newValue,&pDVar3->positiveSuffix,len);
      bVar6 = UVar4 != '\0';
    }
  }
  else {
    bVar6 = (bool)(*(byte *)&(pDVar3->positiveSuffix).fUnion & 1);
  }
  if (bVar6 == false) {
    UnicodeString::operator=
              (&((this->fields->properties).
                 super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr)->
                positiveSuffix,newValue);
    uStack_18 = (ulong)(uint)uStack_18;
    touch(this,(UErrorCode *)((long)&uStack_18 + 4));
  }
  return;
}

Assistant:

void DecimalFormat::setPositiveSuffix(const UnicodeString& newValue) {
    if (newValue == fields->properties->positiveSuffix) { return; }
    fields->properties->positiveSuffix = newValue;
    touchNoError();
}